

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O0

void helics::
     addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *section,string *name1,string *name2,anon_class_8_1_36d583d8 callback)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  string *in_RDX;
  json *in_RSI;
  Translator *in_RDI;
  bool found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  anon_class_8_1_36d583d8 callback_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 local_21;
  anon_class_8_1_36d583d8 callback_01;
  
  callback_00.translator = in_RDI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  bVar1 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                    (in_RSI,in_RDX,callback_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  local_21 = (bool)(bVar1 & 1);
  if (local_21 == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
    local_21 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                         (in_RSI,in_RDX,callback_00);
    in_stack_ffffffffffffff16 = local_21;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0);
  }
  if (local_21 == false) {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffef0);
    iVar2 = toupper((int)*pvVar3);
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffef0);
    *pvVar3 = (value_type)iVar2;
    callback_01.translator = callback_00.translator;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
    addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
              (in_RSI,in_RDX,callback_01);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               callback_00.translator);
  }
  return;
}

Assistant:

void addTargetVariations(const Block& section,
                         const std::string& name1,
                         std::string name2,
                         Callable callback)
{
    bool found = addTargets(section, name1 + "_" + name2, callback);
    if (!found) {
        found = addTargets(section, name1 + name2, callback);
    }
    if (!found) {
        name2.front() = std::toupper(name2.front());
        addTargets(section, name1 + name2, callback);
    }
}